

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O3

REF_STATUS
ref_iso_segment_segment
          (REF_DBL *candidate0,REF_DBL *candidate1,REF_DBL *segment0,REF_DBL *segment1,REF_DBL *tt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  REF_STATUS RVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  *tt = 0.0;
  tt[1] = 0.0;
  dVar1 = *candidate0;
  dVar13 = candidate0[1];
  dVar2 = *segment1;
  dVar3 = segment1[1];
  dVar4 = *segment0;
  dVar5 = segment0[1];
  dVar6 = *candidate1;
  dVar7 = candidate1[1];
  dVar12 = ((dVar7 - dVar13) * (dVar4 - dVar1) - (dVar6 - dVar1) * (dVar5 - dVar13)) * 0.5;
  dVar11 = ((dVar13 - dVar7) * (dVar2 - dVar6) - (dVar1 - dVar6) * (dVar3 - dVar7)) * 0.5 + dVar12;
  dVar14 = dVar11 * 1e+20;
  if (dVar14 <= -dVar14) {
    dVar14 = -dVar14;
  }
  dVar15 = dVar12;
  if (dVar12 <= -dVar12) {
    dVar15 = -dVar12;
  }
  RVar8 = 4;
  if (dVar15 < dVar14) {
    dVar13 = ((dVar3 - dVar5) * (dVar1 - dVar4) - (dVar2 - dVar4) * (dVar13 - dVar5)) * 0.5;
    *tt = dVar12 / dVar11;
    dVar1 = ((dVar5 - dVar3) * (dVar6 - dVar2) - (dVar7 - dVar3) * (dVar4 - dVar2)) * 0.5 + dVar13;
    auVar9._0_8_ = dVar1 * 1e+20;
    auVar9._8_8_ = dVar13;
    auVar10._8_8_ = -dVar13;
    auVar10._0_8_ = -auVar9._0_8_;
    auVar10 = maxpd(auVar9,auVar10);
    if (auVar10._8_8_ < auVar10._0_8_) {
      tt[1] = dVar13 / dVar1;
      RVar8 = 0;
    }
  }
  return RVar8;
}

Assistant:

REF_FCN REF_STATUS ref_iso_segment_segment(REF_DBL *candidate0,
                                           REF_DBL *candidate1,
                                           REF_DBL *segment0, REF_DBL *segment1,
                                           REF_DBL *tt) {
  double cand0_area, cand1_area;
  double seg0_area, seg1_area;
  double total_area;

  tt[0] = 0.0;
  tt[1] = 0.0;

  /*         c1 tt[1]
   *        /
   *  s0---+----s1 tt[0]
   *      /
   *    c0
   */

  cand0_area = ref_iso_area(candidate0, segment1, segment0);
  cand1_area = ref_iso_area(candidate1, segment0, segment1);
  seg0_area = ref_iso_area(segment0, candidate1, candidate0);
  seg1_area = ref_iso_area(segment1, candidate0, candidate1);

  total_area = seg0_area + seg1_area;
  if (ref_math_divisible(seg0_area, total_area)) {
    tt[0] = seg0_area / total_area;
  } else {
    return REF_DIV_ZERO;
  }

  total_area = cand0_area + cand1_area;
  if (ref_math_divisible(cand0_area, total_area)) {
    tt[1] = cand0_area / total_area;
  } else {
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}